

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O0

Event * __thiscall EventQueue::WaitEvent(EventQueue *this,uint32_t mstimeout)

{
  bool bVar1;
  EventQueue *local_40;
  Event *ev;
  AutoLock _auto_lock_;
  uint32_t mstimeout_local;
  EventQueue *this_local;
  
  _auto_lock_._20_4_ = mstimeout;
  AutoLock::AutoLock((AutoLock *)&ev,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x58);
  local_40 = (EventQueue *)pollEventInternal(this);
  do {
    while( true ) {
      if (local_40 != (EventQueue *)0x0) {
        this_local = local_40;
        goto LAB_001218d3;
      }
      bVar1 = Condition::Wait(&this->mWait,&this->mLock,_auto_lock_._20_4_);
      if (!bVar1) break;
      local_40 = (EventQueue *)pollEventInternal(this);
      if (local_40 == (EventQueue *)0x0) {
        jh_log_print(0,"Event *EventQueue::WaitEvent(uint32_t)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,100,"Signalled empty queue");
      }
    }
  } while (_auto_lock_._20_4_ == 0);
  this_local = (EventQueue *)0x0;
LAB_001218d3:
  AutoLock::~AutoLock((AutoLock *)&ev);
  return (Event *)this_local;
}

Assistant:

Event *EventQueue::WaitEvent( uint32_t mstimeout )
{
	TRACE_BEGIN( LOG_LVL_NOISE );

	DebugAutoLock( mLock );
	Event *ev = pollEventInternal();

	while ( ev == NULL )
	{
		LOG( "timeout %d", mstimeout );
		if ( mWait.Wait( mLock, mstimeout ) )
		{
			LOG( "signalled" );
			ev = pollEventInternal();
			if ( ev == NULL )
			{
				LOG_ERR( "Signalled empty queue" );
			}
		}
		else if ( mstimeout > 0 )
			return NULL;
		
		LOG( "done" );
	}	
	
	return ev;
}